

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

bool __thiscall efsw::FileInfo::isReadable(FileInfo *this)

{
  int iVar1;
  __uid_t _Var2;
  bool local_19;
  FileInfo *this_local;
  
  if (isReadable()::isRoot == '\0') {
    iVar1 = __cxa_guard_acquire(&isReadable()::isRoot);
    if (iVar1 != 0) {
      _Var2 = getuid();
      isReadable::isRoot = _Var2 == 0;
      __cxa_guard_release(&isReadable()::isRoot);
    }
  }
  local_19 = true;
  if ((isReadable::isRoot & 1U) == 0) {
    local_19 = (this->Permissions & 0x100) != 0;
  }
  return local_19;
}

Assistant:

bool FileInfo::isReadable() const {
#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	static bool isRoot = getuid() == 0;
	return isRoot || 0 != S_ISRDBL( Permissions );
#else
	return 0 != S_ISRDBL( Permissions );
#endif
}